

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GroupDestinationRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Group Destination Record",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\nGroup Bit Field:       ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nPriority:              ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nLine State Command:    ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString GroupDestinationRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Group Destination Record"
       << "\nGroup Bit Field:       " << m_ui32GrpBtField
       << "\nPriority:              " << ( KUINT16 )m_ui8DstPriority
       << "\nLine State Command:    " << ( KUINT16 )m_ui8LnStCmd
       << "\n";

    return ss.str();
}